

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

char * bif_stristr(char *s1,char *s2)

{
  int iVar1;
  ulong uVar2;
  size_t len;
  
  uVar2 = strlen(s1);
  len = strlen(s2);
  while( true ) {
    if (uVar2 < len) {
      return (char *)0x0;
    }
    iVar1 = memicmp(s1,s2,len);
    if (iVar1 == 0) break;
    s1 = s1 + 1;
    uVar2 = uVar2 - 1;
  }
  return s1;
}

Assistant:

static char *bif_stristr(const char *s1, const char *s2)
{
    size_t s1len;
    size_t s2len;

    /* scan for a match */
    for (s1len = strlen(s1), s2len = strlen(s2) ; s1len >= s2len ;
         ++s1, --s1len)
    {
        /* if this is a match, return this substring */
        if (memicmp(s1, s2, s2len) == 0)
            return (char *)s1;
    }

    return 0;
}